

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O2

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo1(Segment *this)

{
  double dVar1;
  double m10;
  double m01;
  double local_60;
  double local_58;
  uint64_t local_50;
  double m00;
  uint64_t local_40 [3];
  
  m00 = 0.0;
  m01 = 0.0;
  local_58 = getNormalMoment(this,(uint64_t *)&m00,(uint64_t *)&m01);
  m01 = 0.0;
  m10 = 4.94065645841247e-324;
  m00 = local_58;
  m01 = getNormalMoment(this,(uint64_t *)&m01,(uint64_t *)&m10);
  m10 = 4.94065645841247e-324;
  local_50 = 0;
  m10 = getNormalMoment(this,(uint64_t *)&m10,&local_50);
  local_50 = 2;
  local_40[2] = 0;
  local_60 = getCentralMoment(this,&local_50,local_40 + 2,&m00,&m10,&m01);
  local_40[1] = 0;
  local_40[0] = 2;
  dVar1 = getCentralMoment(this,local_40 + 1,local_40,&m00,&m10,&m01);
  return (dVar1 + local_60) / (local_58 * local_58);
}

Assistant:

const double
Segment::getHuMomentInvariantNo1()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            getCentralMoment(2, 0, m00, m10, m01) +
            getCentralMoment(0, 2, m00, m10, m01)
        )
        /
        std::pow(m00, 2)
    );
}